

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O2

void vkt::texture::util::wrapCubemapEdge
               (IVec2 *coord,IVec2 *size,int faceNdx,IVec2 *newCoord,int *newFaceNdx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Vector<int,_2> local_50;
  IVec2 edgeOffset;
  Vector<int,_2> local_40;
  Vector<int,_2> local_38;
  
  if (coord->m_data[1] < 0) {
    lVar3 = 0;
  }
  else if (coord->m_data[0] < 1) {
    lVar3 = (ulong)(coord->m_data[1] == 0) + 2;
  }
  else {
    lVar3 = 1;
  }
  lVar4 = (long)faceNdx * 0x10;
  iVar1 = *(int *)((anonymous_namespace)::adjacentEdges + lVar3 * 4 + lVar4);
  local_50.m_data = *(int (*) [2])((anonymous_namespace)::edgeFactors + (long)iVar1 * 8);
  local_40.m_data[0] = 1;
  local_40.m_data[1] = 1;
  tcu::operator-(size,&local_40);
  tcu::operator*(&local_50,&local_38);
  iVar2 = *(int *)((anonymous_namespace)::edgeComponent + lVar3 * 4);
  if (*(int *)((anonymous_namespace)::adjacentEdgeDirs + lVar3 * 4 + lVar4) < 1) {
    iVar2 = ~coord->m_data[iVar2] + size->m_data[iVar2];
  }
  else {
    iVar2 = coord->m_data[iVar2];
  }
  iVar1 = *(int *)((anonymous_namespace)::edgeComponent + (long)iVar1 * 4);
  newCoord->m_data[iVar1] = iVar2;
  newCoord->m_data[1 - iVar1] = 0;
  tcu::Vector<int,_2>::operator+=(newCoord,&edgeOffset);
  *newFaceNdx = *(int *)((anonymous_namespace)::adjacentFaces + lVar3 * 4 + lVar4);
  return;
}

Assistant:

void wrapCubemapEdge (const IVec2&	coord,
					  const IVec2&	size,
					  const int		faceNdx,
					  IVec2&		newCoord,
					  int&			newFaceNdx)
{
	int edgeNdx = -1;

	if (coord[1] < 0)
	{
		edgeNdx = 0;
	}
	else if (coord[0] > 0)
	{
		edgeNdx = 1;
	}
	else if (coord[1] > 0)
	{
		edgeNdx = 2;
	}
	else
	{
		edgeNdx = 3;
	}

	const int		adjacentEdgeNdx = adjacentEdges[faceNdx][edgeNdx];
	const IVec2		edgeFactor		= IVec2(edgeFactors[adjacentEdgeNdx][0],
											edgeFactors[adjacentEdgeNdx][1]);
	const IVec2		edgeOffset		= edgeFactor * (size - IVec2(1));

	if (adjacentEdgeDirs[faceNdx][edgeNdx] > 0)
	{
		newCoord[edgeComponent[adjacentEdgeNdx]] = coord[edgeComponent[edgeNdx]];
	}
	else
	{
		newCoord[edgeComponent[adjacentEdgeNdx]] =
		    size[edgeComponent[edgeNdx]] - coord[edgeComponent[edgeNdx]] - 1;
	}

	newCoord[1 - edgeComponent[adjacentEdgeNdx]] = 0;
	newCoord += edgeOffset;

	newFaceNdx = adjacentFaces[faceNdx][edgeNdx];
}